

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

const_iterator * __thiscall
stx::
btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
::upper_bound(const_iterator *__return_storage_ptr__,
             btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
             *this,key_type *key)

{
  inner_node *inner;
  leaf_node *plVar1;
  unsigned_short uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  
  plVar1 = (leaf_node *)this->m_root;
  if (plVar1 == (leaf_node *)0x0) {
    plVar1 = this->m_tailleaf;
    if (plVar1 == (leaf_node *)0x0) {
      uVar2 = 0;
    }
    else {
      uVar2 = (plVar1->super_node).slotuse;
    }
    (__return_storage_ptr__->temp_value).first = 0.0;
    (__return_storage_ptr__->temp_value).second = (BufferNode<double,_long> *)0x0;
    __return_storage_ptr__->currnode = plVar1;
    __return_storage_ptr__->currslot = uVar2;
    return __return_storage_ptr__;
  }
  if ((plVar1->super_node).level != 0) {
    do {
      uVar4 = (ulong)(plVar1->super_node).slotuse;
      if (uVar4 == 0) {
        lVar5 = 0;
      }
      else {
        uVar6 = 0;
        do {
          uVar3 = uVar6;
          if (*key < plVar1->slotkey[uVar6 - 2]) break;
          uVar6 = uVar6 + 1;
          uVar3 = uVar4;
        } while (uVar4 != uVar6);
        lVar5 = (long)(int)uVar3;
      }
      plVar1 = (leaf_node *)plVar1->slotkey[lVar5 + 0xe];
    } while ((plVar1->super_node).level != 0);
  }
  uVar4 = (ulong)(plVar1->super_node).slotuse;
  if (uVar4 == 0) {
    uVar6 = 0;
  }
  else {
    uVar3 = 0;
    do {
      uVar6 = uVar3;
      if (*key < plVar1->slotkey[uVar3]) break;
      uVar3 = uVar3 + 1;
      uVar6 = uVar4;
    } while (uVar4 != uVar3);
  }
  __return_storage_ptr__->currnode = plVar1;
  __return_storage_ptr__->currslot = (unsigned_short)uVar6;
  (__return_storage_ptr__->temp_value).first = 0.0;
  (__return_storage_ptr__->temp_value).second = (BufferNode<double,_long> *)0x0;
  return __return_storage_ptr__;
}

Assistant:

const_iterator upper_bound(const key_type& key) const
        {
            const node *n = m_root;
            if (!n) return end();

            while(!n->isleafnode())
            {
                const inner_node *inner = static_cast<const inner_node*>(n);
                int slot = find_upper(inner, key);

                n = inner->childid[slot];
            }

            const leaf_node *leaf = static_cast<const leaf_node*>(n);

            int slot = find_upper(leaf, key);
            return const_iterator(leaf, slot);
        }